

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

int lws_http_to_fallback(lws *wsi,uchar *obuf,size_t olen)

{
  byte bVar1;
  short sVar2;
  lws_callback_reasons lVar3;
  lws_vhost *plVar4;
  lws_protocols *plVar5;
  char *name;
  int iVar6;
  uint uVar7;
  lws_role_ops *plVar8;
  lws_protocols *plVar9;
  short sVar10;
  lws_callback_reasons lVar11;
  lws_protocols *p;
  lws_role_ops *ops;
  char ipbuf [64];
  
  plVar4 = wsi->vhost;
  bVar1 = plVar4->raw_protocol_index;
  plVar5 = plVar4->protocols;
  ops = &role_ops_raw_skt;
  if (plVar4->listen_accept_role != (char *)0x0) {
    plVar8 = lws_role_by_name(plVar4->listen_accept_role);
    if (plVar8 != (lws_role_ops *)0x0) {
      ops = lws_role_by_name(wsi->vhost->listen_accept_role);
    }
  }
  name = wsi->vhost->listen_accept_protocol;
  p = plVar5 + bVar1;
  if (name != (char *)0x0) {
    plVar9 = lws_vhost_name_to_protocol(wsi->vhost,name);
    if (plVar9 != (lws_protocols *)0x0) {
      p = plVar9;
    }
  }
  lws_bind_protocol(wsi,p,"lws_http_to_fallback");
  lws_role_transition(wsi,0x20000000,LRS_ESTABLISHED,ops);
  lws_header_table_detach(wsi,0);
  lws_set_timeout(wsi,NO_PENDING_TIMEOUT,0);
  lVar3 = *(lws_callback_reasons *)wsi->role_ops->adoption_cb;
  lVar11 = LWS_CALLBACK_SERVER_NEW_CLIENT_INSTANTIATED;
  if ((short)lVar3 != 0) {
    lVar11 = lVar3;
  }
  ipbuf[0] = '\0';
  lws_get_peer_simple(wsi,ipbuf,0x40);
  _lws_log(4,"%s: vh %s, peer: %s, role %s, protocol %s, cb %d, ah %p\n","lws_http_to_fallback",
           wsi->vhost->name,ipbuf,ops->name,p->name,(ulong)(lVar11 & 0xffff),(wsi->http).ah);
  iVar6 = (*wsi->protocol->callback)(wsi,lVar11 & 0xffff,wsi->user_space,(void *)0x0,0);
  uVar7 = 1;
  if (iVar6 == 0) {
    sVar2 = *(short *)((long)wsi->role_ops->rx_cb + (ulong)(wsi->wsistate >> 0x1c & 2));
    sVar10 = 0x3b;
    if (sVar2 != 0) {
      sVar10 = sVar2;
    }
    iVar6 = (*wsi->protocol->callback)(wsi,(lws_callback_reasons)sVar10,wsi->user_space,obuf,olen);
    uVar7 = (uint)(iVar6 != 0);
  }
  return uVar7;
}

Assistant:

int
lws_http_to_fallback(struct lws *wsi, unsigned char *obuf, size_t olen)
{
	const struct lws_role_ops *role = &role_ops_raw_skt;
	const struct lws_protocols *p1, *protocol =
			 &wsi->vhost->protocols[wsi->vhost->raw_protocol_index];
	char ipbuf[64];
	int n;

	if (wsi->vhost->listen_accept_role &&
	    lws_role_by_name(wsi->vhost->listen_accept_role))
		role = lws_role_by_name(wsi->vhost->listen_accept_role);

	if (wsi->vhost->listen_accept_protocol) {
		p1 = lws_vhost_name_to_protocol(wsi->vhost,
			    wsi->vhost->listen_accept_protocol);
		if (p1)
			protocol = p1;
	}

	lws_bind_protocol(wsi, protocol, __func__);

	lws_role_transition(wsi, LWSIFR_SERVER, LRS_ESTABLISHED, role);

	lws_header_table_detach(wsi, 0);
	lws_set_timeout(wsi, NO_PENDING_TIMEOUT, 0);

	n = LWS_CALLBACK_SERVER_NEW_CLIENT_INSTANTIATED;
	if (wsi->role_ops->adoption_cb[0])
		n = wsi->role_ops->adoption_cb[0];

	ipbuf[0] = '\0';
#if !defined(LWS_PLAT_OPTEE)
	lws_get_peer_simple(wsi, ipbuf, sizeof(ipbuf));
#endif

	lwsl_notice("%s: vh %s, peer: %s, role %s, "
		    "protocol %s, cb %d, ah %p\n", __func__, wsi->vhost->name,
		    ipbuf, role->name, protocol->name, n, wsi->http.ah);

	if ((wsi->protocol->callback)(wsi, n, wsi->user_space, NULL, 0))
		return 1;

	n = LWS_CALLBACK_RAW_RX;
	if (wsi->role_ops->rx_cb[lwsi_role_server(wsi)])
		n = wsi->role_ops->rx_cb[lwsi_role_server(wsi)];
	if (wsi->protocol->callback(wsi, n, wsi->user_space, obuf, olen))
		return 1;

	return 0;
}